

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
* __thiscall
slang::parsing::Preprocessor::getDefinedMacros
          (vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
           *__return_storage_ptr__,Preprocessor *this)

{
  pointer *pppDVar1;
  EntryPointer psVar2;
  EntryPointer psVar3;
  size_t sVar4;
  DefineDirectiveSyntax *pDVar5;
  iterator __position;
  pointer ppDVar6;
  pointer ppDVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __i;
  pointer ppDVar11;
  EntryPointer psVar12;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = (this->macros).
           super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>_>
           .entries;
  lVar10 = 0;
  do {
    lVar9 = lVar10;
    lVar10 = lVar9 + 0x28;
  } while ((&psVar3->distance_from_desired)[lVar9] < '\0');
  sVar4 = (this->macros).
          super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>_>
          .num_slots_minus_one;
  lVar10 = (long)(this->macros).
                 super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>_>
                 .max_lookups;
  if (lVar10 * 0x28 + sVar4 * 0x28 + 0x28 != lVar9 + 0x28) {
    psVar12 = (EntryPointer)(&psVar3->distance_from_desired + lVar9);
    do {
      pDVar5 = (psVar12->field_1).value.second.syntax;
      if (pDVar5 != (DefineDirectiveSyntax *)0x0) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
          ::_M_realloc_insert<slang::syntax::DefineDirectiveSyntax_const*const&>
                    ((vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
                      *)__return_storage_ptr__,__position,
                     (DefineDirectiveSyntax **)((long)&psVar12->field_1 + 0x10));
        }
        else {
          *__position._M_current = pDVar5;
          pppDVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + 1;
        }
      }
      do {
        psVar2 = psVar12 + 1;
        psVar12 = psVar12 + 1;
      } while (psVar2->distance_from_desired < '\0');
    } while (psVar12 != psVar3 + sVar4 + lVar10);
    ppDVar6 = (__return_storage_ptr__->
              super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppDVar7 = (__return_storage_ptr__->
              super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppDVar6 != ppDVar7) {
      uVar8 = (long)ppDVar7 - (long)ppDVar6 >> 3;
      lVar10 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<slang::parsing::Preprocessor::getDefinedMacros()const::__0>>
                (ppDVar6,ppDVar7,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppDVar7 - (long)ppDVar6 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<slang::parsing::Preprocessor::getDefinedMacros()const::__0>>
                  (ppDVar6,ppDVar7);
      }
      else {
        ppDVar11 = ppDVar6 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<slang::parsing::Preprocessor::getDefinedMacros()const::__0>>
                  (ppDVar6,ppDVar11);
        for (; ppDVar11 != ppDVar7; ppDVar11 = ppDVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<slang::parsing::Preprocessor::getDefinedMacros()const::__0>>
                    (ppDVar11);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const DefineDirectiveSyntax*> Preprocessor::getDefinedMacros() const {
    std::vector<const DefineDirectiveSyntax*> results;
    for (auto& [name, def] : macros) {
        if (def.syntax)
            results.push_back(def.syntax);
    }

    std::sort(results.begin(), results.end(),
              [](const DefineDirectiveSyntax* a, const DefineDirectiveSyntax* b) {
                  return a->name.valueText() < b->name.valueText();
              });
    return results;
}